

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_mulsu2_i32_mips
               (TCGContext_conflict3 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 rh_local;
  TCGv_i32 rl_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_ext_i32_i64_mips(tcg_ctx,ret,arg1);
  tcg_gen_extu_i32_i64_mips(tcg_ctx,ret_00,arg2);
  tcg_gen_mul_i64_mips(tcg_ctx,ret,ret,ret_00);
  tcg_gen_extr_i64_i32_mips(tcg_ctx,rl,rh,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_mulsu2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_REG_BITS == 32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, arg1, arg2);
        /* Adjust for negative input for the signed arg1.  */
        tcg_gen_sari_i32(tcg_ctx, t2, arg1, 31);
        tcg_gen_and_i32(tcg_ctx, t2, t2, arg2);
        tcg_gen_sub_i32(tcg_ctx, rh, t1, t2);
        tcg_gen_mov_i32(tcg_ctx, rl, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        tcg_temp_free_i32(tcg_ctx, t2);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ext_i32_i64(tcg_ctx, t0, arg1);
        tcg_gen_extu_i32_i64(tcg_ctx, t1, arg2);
        tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}